

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::NodeLoader::begin__lookat(NodeLoader *this,lookat__AttributeData *attributeData)

{
  bool bVar1;
  
  bVar1 = beginTransformation<COLLADAFW::Lookat>(this,attributeData->sid);
  return bVar1;
}

Assistant:

bool NodeLoader::begin__lookat ( const lookat__AttributeData& attributeData )
	{
		return beginTransformation<COLLADAFW::Lookat>( attributeData.sid );
	}